

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerTraversalDecoder::Start
          (MeshEdgebreakerTraversalDecoder *this,DecoderBuffer *out_buffer)

{
  bool bVar1;
  MeshEdgebreakerTraversalDecoder *in_RSI;
  void *in_RDI;
  MeshEdgebreakerTraversalDecoder *in_stack_00000038;
  undefined1 local_1;
  
  bVar1 = DecodeTraversalSymbols(in_RSI);
  if (bVar1) {
    bVar1 = DecodeStartFaces(in_RSI);
    if (bVar1) {
      bVar1 = DecodeAttributeSeams(in_stack_00000038);
      if (bVar1) {
        memcpy(in_RSI,in_RDI,0x34);
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Start(DecoderBuffer *out_buffer) {
    // Decode symbols from the main buffer decoder and face configurations from
    // the start_face_buffer decoder.
    if (!DecodeTraversalSymbols()) {
      return false;
    }

    if (!DecodeStartFaces()) {
      return false;
    }

    if (!DecodeAttributeSeams()) {
      return false;
    }
    *out_buffer = buffer_;
    return true;
  }